

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.c
# Opt level: O2

void icetCommGather(void *sendbuf,IceTSizeType sendcount,IceTEnum datatype,void *recvbuf,int root)

{
  int iVar1;
  IceTInt IVar2;
  IceTCommunicator pIVar3;
  IceTInt *pIVar4;
  
  pIVar3 = icetGetCommunicator();
  if (0x40000000 < sendcount) {
    icetRaiseDiagnostic("Encountered a ridiculously large message.",0xfffffffa,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/communication.c"
                        ,0x5c);
  }
  iVar1 = icetCommRank();
  if (iVar1 != root) {
    pIVar4 = icetUnsafeStateGetInteger(0xc9);
    iVar1 = *pIVar4;
    IVar2 = icetTypeWidth(datatype);
    icetStateSetInteger(0xc9,iVar1 + IVar2 * sendcount);
  }
  (*pIVar3->Gather)(pIVar3,sendbuf,sendcount,datatype,recvbuf,root);
  return;
}

Assistant:

void icetCommGather(const void *sendbuf,
                    IceTSizeType sendcount,
                    IceTEnum datatype,
                    void *recvbuf,
                    int root)
{
    IceTCommunicator comm = icetGetCommunicator();
    icetCommCheckCount(sendcount);
    if (root != icetCommRank()) {
        icetAddSent(sendcount, datatype);
    }
#ifdef DEBUG
    comm->Barrier(comm);
#endif
    comm->Gather(comm, sendbuf, sendcount, datatype, recvbuf, root);
}